

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O0

Globals * __thiscall
OpenMD::SimCreator::parseFile
          (SimCreator *this,istream *rawMetaDataStream,string *filename,int mdFileVersion,
          int startOfMetaDataBlock)

{
  MismatchedCharException *e;
  MismatchedTokenException *e_1;
  NoViableAltForCharException *e_2;
  NoViableAltException *e_3;
  TokenStreamRecognitionException *e_4;
  TokenStreamIOException *e_5;
  TokenStreamException *e_6;
  RecognitionException *e_7;
  CharStreamException *e_8;
  OpenMDException *e_9;
  exception *e_10;
  MDTreeParser treeParser;
  ASTFactory factory;
  FilenameObserver observer;
  MDParser parser;
  MDLexer lexer;
  SimplePreprocessor preprocessor;
  stringstream ppStream;
  Globals *simParams;
  undefined4 in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  Globals *in_stack_fffffffffffff900;
  TokenStream *in_stack_fffffffffffff908;
  ASTFactory *in_stack_fffffffffffff910;
  istream *in_stack_fffffffffffff918;
  MDLexer *in_stack_fffffffffffff920;
  ASTFactory *in_stack_fffffffffffff930;
  RefAST *in_stack_fffffffffffff938;
  MDTreeParser *in_stack_fffffffffffff940;
  MDParser *in_stack_fffffffffffff950;
  ostream *in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9ac;
  string *in_stack_fffffffffffff9b0;
  istream *in_stack_fffffffffffff9b8;
  SimplePreprocessor *in_stack_fffffffffffff9c0;
  TreeParser local_348 [4];
  ASTFactory local_2c0;
  FilenameObserver local_290;
  MDParser local_280;
  MDLexer local_258;
  stringstream local_1b0 [392];
  Globals *local_28;
  
  local_28 = (Globals *)0x0;
  std::__cxx11::stringstream::stringstream(local_1b0);
  SimplePreprocessor::preprocess
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
             in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a0);
  MDLexer::MDLexer(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  antlr::CharScanner::setFilename
            ((CharScanner *)in_stack_fffffffffffff900,
             (string *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  MDLexer::initDeferredLineCount(&local_258);
  MDParser::MDParser((MDParser *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  antlr::Parser::setFilename
            ((Parser *)in_stack_fffffffffffff900,
             (string *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  FilenameObserver::FilenameObserver(&local_290);
  FilenameObserver::setLexer(&local_290,&local_258);
  FilenameObserver::setParser(&local_290,&local_280);
  MDLexer::setObserver(&local_258,&local_290);
  antlr::ASTFactory::ASTFactory(in_stack_fffffffffffff930);
  MDParser::initializeASTFactory
            ((MDParser *)in_stack_fffffffffffff900,
             (ASTFactory *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  antlr::Parser::setASTFactory((Parser *)&local_280,&local_2c0);
  MDParser::mdfile(in_stack_fffffffffffff950);
  MDTreeParser::MDTreeParser((MDTreeParser *)in_stack_fffffffffffff920);
  MDTreeParser::initializeASTFactory(&local_2c0);
  antlr::TreeParser::setASTFactory(local_348,&local_2c0);
  MDParser::getAST((MDParser *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  local_28 = MDTreeParser::walkTree(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  antlr::ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_fffffffffffff910)
  ;
  MDTreeParser::~MDTreeParser((MDTreeParser *)in_stack_fffffffffffff900);
  antlr::ASTFactory::~ASTFactory(in_stack_fffffffffffff910);
  MDParser::~MDParser((MDParser *)in_stack_fffffffffffff900);
  MDLexer::~MDLexer((MDLexer *)0x13d8ae);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  Globals::setMDfileVersion(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
  return local_28;
}

Assistant:

Globals* SimCreator::parseFile(std::istream& rawMetaDataStream,
                                 const std::string& filename, int mdFileVersion,
                                 int startOfMetaDataBlock) {
    Globals* simParams = NULL;
    try {
      // Create a preprocessor that preprocesses md file into an ostringstream
      std::stringstream ppStream;
#ifdef IS_MPI
      int streamSize;
      const int primaryNode = 0;

      if (worldRank == primaryNode) {
        MPI_Bcast(&mdFileVersion, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
#endif
        SimplePreprocessor preprocessor;
        preprocessor.preprocess(rawMetaDataStream, filename,
                                startOfMetaDataBlock, ppStream);

#ifdef IS_MPI
        // broadcasting the stream size
        streamSize = ppStream.str().size() + 1;
        MPI_Bcast(&streamSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        MPI_Bcast(static_cast<void*>(const_cast<char*>(ppStream.str().c_str())),
                  streamSize, MPI_CHAR, primaryNode, MPI_COMM_WORLD);
      } else {
        MPI_Bcast(&mdFileVersion, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // get stream size
        MPI_Bcast(&streamSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        char* buf = new char[streamSize];
        assert(buf);

        // receive file content
        MPI_Bcast(buf, streamSize, MPI_CHAR, primaryNode, MPI_COMM_WORLD);

        ppStream.str(buf);
        delete[] buf;
      }
#endif
      // Create a scanner that reads from the input stream
      MDLexer lexer(ppStream);
      lexer.setFilename(filename);
      lexer.initDeferredLineCount();

      // Create a parser that reads from the scanner
      MDParser parser(lexer);
      parser.setFilename(filename);

      // Create an observer that synchorizes file name change
      FilenameObserver observer;
      observer.setLexer(&lexer);
      observer.setParser(&parser);
      lexer.setObserver(&observer);
      antlr::ASTFactory factory;
      parser.initializeASTFactory(factory);
      parser.setASTFactory(&factory);
      parser.mdfile();
      // Create a tree parser that reads information into Globals
      MDTreeParser treeParser;
      treeParser.initializeASTFactory(factory);
      treeParser.setASTFactory(&factory);
      simParams = treeParser.walkTree(parser.getAST());
    }

    catch (antlr::MismatchedCharException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mismatched Character: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::MismatchedTokenException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Mismatched Token: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::NoViableAltForCharException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No Viable Alternative for Character: %s in file %s at line %d, "
               "column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::NoViableAltException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No Viable Alternative: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamRecognitionException& e) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Token Stream Recognition: %s in file %s at line %d, column %d\n",
          e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
          e.getColumn());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamIOException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Token Stream IO exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    }

    catch (antlr::TokenStreamException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Token Stream exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::RecognitionException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Recognition exception: %s in file %s at line %d, column %d\n",
               e.getMessage().c_str(), e.getFilename().c_str(), e.getLine(),
               e.getColumn());
      painCave.isFatal = 1;
      simError();
    } catch (antlr::CharStreamException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Character Stream exception: %s\n", e.getMessage().c_str());
      painCave.isFatal = 1;
      simError();
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s\n", e.what());
      painCave.isFatal = 1;
      simError();
    } catch (std::exception& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "parser exception: %s\n", e.what());
      painCave.isFatal = 1;
      simError();
    }

    simParams->setMDfileVersion(mdFileVersion);
    return simParams;
  }